

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::reserveVars(SimpSolver *this,Var v)

{
  int min_cap;
  Var local_1c;
  
  local_1c = v;
  Solver::reserveVars(&this->super_Solver,v);
  min_cap = v + 1;
  vec<char>::capacity(&this->frozen,min_cap);
  vec<char>::capacity(&this->eliminated,min_cap);
  if (this->use_simplification == true) {
    vec<int>::capacity(&this->n_occ,min_cap);
    vec<int>::capacity(&this->n_occ,min_cap);
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::init
              (&this->occurs,(EVP_PKEY_CTX *)&local_1c);
    vec<char>::capacity(&this->touched,local_1c + 1);
  }
  return;
}

Assistant:

void SimpSolver::reserveVars(Var v)
{
    Solver::reserveVars(v);

    frozen.capacity(v + 1);
    eliminated.capacity(v + 1);

    if (use_simplification) {
        n_occ.capacity(v + 1);
        n_occ.capacity(v + 1);
        occurs.init(v);
        touched.capacity(v + 1);
    }
}